

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::pair<unsigned_int,unsigned_int>>
               (Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  pointer puVar6;
  const_iterator cVar7;
  ulong uVar8;
  _Rb_tree_header *p_Var9;
  uint uVar10;
  _Base_ptr __s1;
  Entry entry;
  _Rb_tree_node_base local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_218;
  undefined **local_210;
  ulong local_208;
  shared_count sStack_200;
  _Base_ptr local_1f8;
  Column_support *local_1f0;
  undefined1 local_1e8 [16];
  _Base_ptr local_1d8;
  _Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_1d0;
  size_t local_1c0;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = veccont;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((column_content<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>
              *)local_1e8,col);
  local_1f0 = (Column_support *)setcont;
  if (local_1c0 == (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      (local_1d0,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       (local_1e8 + 8),
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_238._M_color._0_1_ = bVar2;
  local_238._M_parent = (_Base_ptr)0x0;
  local_238._M_left = (_Base_ptr)0x0;
  local_1b8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1b8._M_parent = (_Base_ptr)0x1ffb28;
  local_208 = local_208 & 0xffffffffffffff00;
  local_210 = &PTR__lazy_ostream_002463a0;
  sStack_200.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1f8 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_238._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)local_1e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar10 = (uint)((ulong)((long)(local_218->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_218->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if ((col->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      local_238._0_8_ = (_Base_ptr)0x0;
      local_238._M_parent = (_Base_ptr)0x0;
      local_238._M_left = (_Base_ptr)0x0;
      __s1 = (_Base_ptr)0x0;
      goto LAB_00123118;
    }
    lVar4 = std::_Rb_tree_decrement(&(col->column_)._M_t._M_impl.super__Rb_tree_header._M_header);
    uVar10 = *(int *)(*(long *)(lVar4 + 0x20) + 8) + 1;
  }
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_238,(long)(int)uVar10,
             (value_type_conflict1 *)local_1e8,(allocator_type *)&local_1b8);
  __s1 = (_Base_ptr)local_238._0_8_;
  for (p_Var5 = (col->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(col->column_)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    uVar1 = *(uint *)(*(long *)(p_Var5 + 1) + 8);
    if (uVar10 <= uVar1) break;
    (&__s1->_M_color)[uVar1] = *(_Rb_tree_color *)(*(long *)(p_Var5 + 1) + 4);
  }
LAB_00123118:
  puVar6 = (local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_238._M_parent - (long)__s1 ==
      (long)(local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar6) {
    if (local_238._M_parent == __s1) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp(__s1,puVar6,(long)local_238._M_parent - (long)__s1);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  local_210 = (undefined **)CONCAT71(local_210._1_7_,bVar2);
  local_208 = 0;
  sStack_200.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1b8._M_parent = (_Base_ptr)0x1ffb53;
  local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
  local_1e8._0_8_ = &PTR__lazy_ostream_002463a0;
  local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_1d0._M_node = &local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_210,local_1e8,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_200);
  if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_238._0_8_,(long)local_238._M_left - local_238._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_238._M_parent = (_Base_ptr)((ulong)local_238._M_parent & 0xffffffffffffff00);
  local_238._0_8_ = &PTR__lazy_ostream_00246430;
  local_238._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_238._M_right = (_Base_ptr)0x1ff316;
  local_138 = (col->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_128 = &local_138;
  local_140 = (((_Rep_type *)&local_1f0->_M_t)->_M_impl).super__Rb_tree_header._M_node_count;
  local_1b8._M_color._0_1_ = local_138 == local_140;
  local_130 = &local_140;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_1b8._M_left = (_Base_ptr)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_1d0._M_node = (_Base_ptr)&local_128;
  local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
  local_1e8._0_8_ = &PTR__lazy_ostream_002463f0;
  local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1f8 = (_Base_ptr)&local_130;
  local_208 = local_208 & 0xffffffffffffff00;
  local_210 = &PTR__lazy_ostream_002463f0;
  sStack_200.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1b8._M_left);
  if ((local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_210 = (undefined **)
                CONCAT71(local_210._1_7_,
                         (col->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x1ffb7d;
    local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
    local_1e8._0_8_ = &PTR__lazy_ostream_002463a0;
    local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1d0._M_node = &local_238;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_210 = (undefined **)
                CONCAT71(local_210._1_7_,
                         (col->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "!col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x1ffb7d;
    local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
    local_1e8._0_8_ = &PTR__lazy_ostream_002463a0;
    local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1d0._M_node = &local_238;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x1ffaf7;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_200);
  puVar6 = (local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    local_1f0 = &col->column_;
    p_Var9 = &(col->column_)._M_t._M_impl.super__Rb_tree_header;
    uVar10 = 1;
    uVar8 = 0;
    do {
      if (puVar6[uVar8] == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        local_1e8._0_8_ = (undefined **)0xffffffff;
        local_238._0_8_ = (_Base_ptr)local_1e8;
        local_1e8._8_4_ = uVar10 - _S_black;
        cVar7 = std::
                _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*>_>
                ::find(&local_1f0->_M_t,(key_type *)&local_238);
        local_210 = (undefined **)
                    CONCAT71(local_210._1_7_,(_Rb_tree_header *)cVar7._M_node == p_Var9);
        local_208 = 0;
        sStack_200.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "!col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x1ffb91;
        local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
        local_1e8._0_8_ = &PTR__lazy_ostream_002463a0;
        local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_1d0._M_node = &local_238;
        boost::test_tools::tt_detail::report_assertion
                  (&local_210,(_Base_ptr)local_1e8,&local_170,0x12a,1,0,0);
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        local_1e8._0_8_ = (undefined **)0xffffffff;
        local_238._0_8_ = (_Base_ptr)local_1e8;
        local_1e8._8_4_ = uVar10 - _S_black;
        cVar7 = std::
                _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_*>_>
                ::find(&local_1f0->_M_t,(key_type *)&local_238);
        local_210 = (undefined **)
                    CONCAT71(local_210._1_7_,(_Rb_tree_header *)cVar7._M_node != p_Var9);
        local_208 = 0;
        sStack_200.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x1ffb91;
        local_1e8._8_4_ = local_1e8._8_4_ & 0xffffff00;
        local_1e8._0_8_ = &PTR__lazy_ostream_002463a0;
        local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_1b8._M_right = (_Base_ptr)0x1ffa84;
        local_198 = "";
        local_1d0._M_node = &local_238;
        boost::test_tools::tt_detail::report_assertion
                  (&local_210,(_Base_ptr)local_1e8,&local_1b8._M_right,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_200);
      uVar8 = (ulong)uVar10;
      puVar6 = (local_218->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
    } while (uVar8 < (ulong)((long)(local_218->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2));
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}